

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v7::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args,locale_ref loc)

{
  char *last;
  buffer_appender<char> out;
  undefined1 value [16];
  undefined1 value_00 [16];
  bool bVar1;
  type tVar2;
  char *pcVar3;
  size_t sVar4;
  float value_01;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  char *end;
  undefined8 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  char *local_80;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  pfs_writer write;
  
  aVar6 = args.field_1;
  pcVar3 = (char *)args.desc_;
  sVar4 = format_str.size_;
  pcVar5 = format_str.data_;
  if ((sVar4 == 2) && (bVar1 = equal2(pcVar5,"{}"), bVar1)) {
    if ((long)pcVar3 < 0) {
      if (((int)(type)args.desc_ < 1) || (tVar2 = (aVar6.args_)->type_, tVar2 == none_type))
      goto LAB_0010d7a7;
    }
    else {
      tVar2 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_0010d7a7:
        pcVar5 = "argument not found";
LAB_0010d7ae:
        error_handler::on_error((error_handler *)&h,pcVar5);
      }
    }
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         *(back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&(aVar6.values_)->field_0;
    value_01 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_;
    h._0_8_ = buf;
    h.parse_context.format_str_.data_ = pcVar3;
    h.parse_context.format_str_.size_ = (size_t)aVar6;
    h.parse_context._16_8_ = loc.locale_;
    switch(tVar2) {
    case int_type:
      write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                ((buffer_appender<char>)buf,(int)value_01);
      break;
    case uint_type:
      write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                ((buffer_appender<char>)buf,(uint)value_01);
      break;
    case long_long_type:
      write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                ((buffer_appender<char>)buf,
                 (longlong)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
      ;
      break;
    case ulong_long_type:
      write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                ((buffer_appender<char>)buf,
                 (unsigned_long_long)
                 out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      break;
    case int128_type:
      value._8_2_ = in_stack_ffffffffffffff70;
      value._0_8_ = in_stack_ffffffffffffff68;
      value._10_6_ = in_stack_ffffffffffffff72;
      write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                ((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      value_00._8_2_ = in_stack_ffffffffffffff70;
      value_00._0_8_ = in_stack_ffffffffffffff68;
      value_00._10_6_ = in_stack_ffffffffffffff72;
      write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                ((detail *)buf,out,(unsigned___int128)value_00);
      break;
    case bool_type:
      write<char,fmt::v7::detail::buffer_appender<char>>
                ((buffer_appender<char>)buf,
                 (bool)((byte)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container & 1));
      break;
    case char_type:
      write<char,fmt::v7::detail::buffer_appender<char>>
                ((buffer_appender<char>)buf,
                 (byte)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      break;
    case float_type:
      write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                ((buffer_appender<char>)buf,value_01);
      break;
    case double_type:
      write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                ((buffer_appender<char>)buf,
                 (double)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      break;
    case last_numeric_type:
      write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                ((buffer_appender<char>)buf,((aVar6.values_)->field_0).long_double_value);
      break;
    case cstring_type:
      write<char,fmt::v7::detail::buffer_appender<char>>
                ((buffer_appender<char>)buf,
                 (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      break;
    case string_type:
      buffer<char>::append<char>
                (buf,(char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container,
                 (char *)(((aVar6.values_)->field_0).custom.format +
                         (long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container));
      break;
    case pointer_type:
      write<char,fmt::v7::detail::buffer_appender<char>>
                ((buffer_appender<char>)buf,
                 (void *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      break;
    case custom_type:
      default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                ((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *)&h,
                 (handle)((aVar6.values_)->field_0).string);
    }
  }
  else {
    h.parse_context._16_8_ = h.parse_context._16_8_ & 0xffffffff00000000;
    last = pcVar5 + sVar4;
    end = pcVar5;
    h.context.loc_.locale_ = loc.locale_;
    h.context.args_.field_1 = aVar6;
    h.context.args_.desc_ = (unsigned_long_long)pcVar3;
    h.context.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)buf;
    h.parse_context.format_str_.size_ = sVar4;
    h.parse_context.format_str_.data_ = pcVar5;
    if ((long)sVar4 < 0x20) {
      while (pcVar3 = end, pcVar3 != last) {
        end = pcVar3 + 1;
        if (*pcVar3 == '}') {
          if ((end == last) || (*end != '}')) {
            pcVar5 = "unmatched \'}\' in format string";
            goto LAB_0010d7ae;
          }
          format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text(&h,pcVar5,end);
          pcVar5 = pcVar3 + 2;
          end = pcVar5;
        }
        else if (*pcVar3 == '{') {
          format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text(&h,pcVar5,pcVar3);
          pcVar5 = parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                             (pcVar3,last,&h);
          end = pcVar5;
        }
      }
      format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::on_text(&h,pcVar5,last);
    }
    else {
      write.handler_ = &h;
      while (pcVar5 != last) {
        local_80 = pcVar5;
        if ((*pcVar5 != '{') &&
           (bVar1 = find<false,char,char_const*>(pcVar5 + 1,last,'{',&local_80), !bVar1)) {
          parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
          ::pfs_writer::operator()(&write,pcVar5,last);
          return;
        }
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::pfs_writer::operator()(&write,pcVar5,local_80);
        pcVar5 = parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                           (local_80,last,&h);
      }
    }
  }
  return;
}

Assistant:

void detail::vformat_to(
    detail::buffer<Char>& buf, basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args,
    detail::locale_ref loc) {
  using iterator = typename buffer_context<Char>::iterator;
  auto out = buffer_appender<Char>(buf);
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<iterator, Char>{out, args, loc},
                     arg);
    return;
  }
  format_handler<iterator, Char, buffer_context<Char>> h(out, format_str, args,
                                                         loc);
  parse_format_string<false>(format_str, h);
}